

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationWeights::incWeight(CollationWeights *this,uint32_t weight,int32_t length)

{
  char cVar1;
  uint in_EAX;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  do {
    cVar1 = (char)length;
    bVar2 = cVar1 * -8 + 0x20;
    uVar4 = weight >> (cVar1 * -8 & 0x1fU) & 0xff;
    lVar5 = (long)length;
    if (uVar4 < this->maxBytes[lVar5]) {
      uVar3 = 0xffffffff >> (cVar1 * '\b' & 0x1fU);
      if (3 < length) {
        uVar3 = 0;
      }
      in_EAX = uVar4 + 1 << (bVar2 & 0x1f) | (-0x100 << (bVar2 & 0x1f) | uVar3) & weight;
    }
    else {
      uVar3 = 0xffffffff >> (cVar1 * '\b' & 0x1fU);
      if (3 < length) {
        uVar3 = 0;
      }
      weight = this->minBytes[length] << (bVar2 & 0x1f) |
               (-0x100 << (bVar2 & 0x1f) | uVar3) & weight;
      length = length + -1;
    }
  } while (this->maxBytes[lVar5] <= uVar4);
  return in_EAX;
}

Assistant:

uint32_t
CollationWeights::incWeight(uint32_t weight, int32_t length) const {
    for(;;) {
        uint32_t byte=getWeightByte(weight, length);
        if(byte<maxBytes[length]) {
            return setWeightByte(weight, length, byte+1);
        } else {
            // Roll over, set this byte to the minimum and increment the previous one.
            weight=setWeightByte(weight, length, minBytes[length]);
            --length;
            U_ASSERT(length > 0);
        }
    }
}